

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

EnumVal * __thiscall flatbuffers::EnumDef::FindByValue(EnumDef *this,string *constant)

{
  bool bVar1;
  EnumVal *pEVar2;
  int64_t i64;
  uint64_t u64;
  uint64_t local_20;
  uint64_t local_18;
  
  if ((this->underlying_type).base_type == BASE_TYPE_ULONG) {
    bVar1 = StringToNumber<unsigned_long>((constant->_M_dataplus)._M_p,&local_18);
    local_20 = local_18;
    if (bVar1) {
LAB_001092fb:
      pEVar2 = ReverseLookup(this,local_20,false);
      return pEVar2;
    }
  }
  else {
    bVar1 = StringToNumber<long>((constant->_M_dataplus)._M_p,(int64_t *)&local_20);
    if (bVar1) goto LAB_001092fb;
  }
  __assert_fail("done",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_parser.cpp"
                ,0x916,"EnumVal *flatbuffers::EnumDef::FindByValue(const std::string &) const");
}

Assistant:

EnumVal *EnumDef::FindByValue(const std::string &constant) const {
  int64_t i64;
  auto done = false;
  if (IsUInt64()) {
    uint64_t u64;  // avoid reinterpret_cast of pointers
    done = StringToNumber(constant.c_str(), &u64);
    i64 = static_cast<int64_t>(u64);
  } else {
    done = StringToNumber(constant.c_str(), &i64);
  }
  FLATBUFFERS_ASSERT(done);
  if (!done) return nullptr;
  return ReverseLookup(i64, false);
}